

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O2

void __thiscall SqlGenerator::generateOutputQueries(SqlGenerator *this)

{
  size_t sVar1;
  View *pVVar2;
  Attribute *pAVar3;
  size_t var;
  ulong uVar4;
  ulong v_id;
  string fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  string local_2d0;
  string orderby;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream ofs;
  
  std::operator+(&fields,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"/output.sql");
  std::ofstream::ofstream(&ofs,(string *)&fields,_S_out);
  std::__cxx11::string::~string((string *)&fields);
  v_id = 0;
  while( true ) {
    sVar1 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar1 <= v_id) break;
    pVVar2 = QueryCompiler::getView
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,v_id);
    std::__cxx11::string::string((string *)&fields,"",(allocator *)&orderby);
    for (uVar4 = 0; uVar4 != 100; uVar4 = uVar4 + 1) {
      if (((pVVar2->_fVars).super__Base_bitset<2UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0) {
        pAVar3 = TreeDecomposition::getAttribute
                           ((this->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,uVar4);
        std::operator+(&orderby,&pAVar3->_name,",");
        std::__cxx11::string::append((string *)&fields);
        std::__cxx11::string::~string((string *)&orderby);
      }
    }
    std::__cxx11::string::string((string *)&orderby,"",(allocator *)&local_270);
    if (fields._M_string_length != 0) {
      std::operator+(&local_270," ORDER BY ",&fields);
      std::__cxx11::string::append((string *)&orderby);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::pop_back();
    }
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(pVVar2->_aggregates).
                              super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(pVVar2->_aggregates).
                              super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      std::__cxx11::to_string(&local_2d0,v_id);
      std::operator+(&local_250,"CAST(agg_",&local_2d0);
      std::operator+(&local_310,&local_250,"_");
      std::__cxx11::to_string(&local_2f0,uVar4);
      std::operator+(&local_290,&local_310,&local_2f0);
      std::operator+(&local_270,&local_290," AS decimal(53,2)),");
      std::__cxx11::string::append((string *)&fields);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    std::__cxx11::string::pop_back();
    std::operator+(&local_2d0,"\\COPY (SELECT ",&fields);
    std::operator+(&local_250,&local_2d0," FROM view_");
    std::__cxx11::to_string(&local_2f0,v_id);
    std::operator+(&local_310,&local_250,&local_2f0);
    std::operator+(&local_290,&local_310,&orderby);
    std::operator+(&local_270,&local_290,
                   ") TO PROGRAM \'cat - >> test.out\' CSV DELIMITER \'|\';\n\n");
    std::operator<<((ostream *)&ofs,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&orderby);
    std::__cxx11::string::~string((string *)&fields);
    v_id = v_id + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void SqlGenerator::generateOutputQueries()
{
    ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/output.sql");
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);
        std::string fields = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                Attribute* attr = _td->getAttribute(var);
                fields += attr->_name+",";
            }
        }
        std::string orderby = "";
        if (!fields.empty())
        {
            orderby += " ORDER BY "+fields;
            orderby.pop_back();
        }

        for (size_t agg = 0; agg < view->_aggregates.size(); ++agg)
            fields += "CAST(agg_"+std::to_string(viewID)+"_"+std::to_string(agg)+
                " AS decimal(53,2)),";

        fields.pop_back();
        
        ofs << "\\COPY (SELECT "+fields+" FROM view_"+to_string(viewID)+orderby+
            ") TO PROGRAM \'cat - >> test.out\' CSV DELIMITER \'|\';\n\n";
    }
    ofs.close();
}